

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void __thiscall ObjectBlockPool<128,_512>::~ObjectBlockPool(ObjectBlockPool<128,_512> *this)

{
  Reset(this);
  FastVector<SmallBlock<128>_*,_false,_false>::~FastVector(&this->objectsToFree);
  FastVector<SmallBlock<128>_*,_false,_false>::~FastVector(&this->objectsToFinalize);
  FastVector<LargeBlock<128,_512>_*,_false,_false>::~FastVector(&this->sortedPages);
  return;
}

Assistant:

~ObjectBlockPool()
	{
		Reset();
	}